

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monotone_partitioning.cc
# Opt level: O2

Monochain_t * __thiscall
PolygonTriangulation::create_monochain
          (PolygonTriangulation *this,uint32_t first_index,uint32_t second_index,
          InsertionSide_t side)

{
  _List_node_base *p_Var1;
  uint32_t local_30;
  uint32_t local_2c;
  
  local_30 = second_index;
  local_2c = first_index;
  std::__cxx11::
  list<PolygonTriangulation::Monochain_t,_std::allocator<PolygonTriangulation::Monochain_t>_>::
  emplace_back<>(&this->monochains_);
  p_Var1 = (this->monochains_).
           super__List_base<PolygonTriangulation::Monochain_t,_std::allocator<PolygonTriangulation::Monochain_t>_>
           ._M_impl._M_node.super__List_node_base._M_prev;
  *(InsertionSide_t *)&p_Var1[1]._M_next = side;
  std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((list<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var1[1]._M_prev,&local_2c);
  std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((list<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var1[1]._M_prev,&local_30);
  return (Monochain_t *)(p_Var1 + 1);
}

Assistant:

PolygonTriangulation::Monochain_t* PolygonTriangulation::create_monochain(
    const uint32_t first_index,
    const uint32_t second_index,
    const InsertionSide_t side
) {
  /// * For a monochain, vertices are always added to the same side, left or right.
  /// This is due to the nature of monochain and the vertical trapezoidation.
  ///
  /// * We need to know the left or right position only when pushing the first
  /// two vertices, For this we check if vertices belong to left / right segment,
  /// if they both does not belong to it (2 middles vertices), we took the min
  /// and max values.
  ///
  /// * When entering a new monochain we know the side of insertion by looking
  /// at the entering side edge value and comparing it to the trapezoid values
  /// (ie. by entering on the right, the right edges must include both the max and
  /// min trapezoid y index to be the inserting side).
  ///  If both diagonal extremities are middle vertices, the main edge is the
  /// opposite one (of previous SIDE), otherwise it MUST contains one of the
  /// trapezoid vertex (min / max)
  ///
  /// * [ the real special case is diagonals with middle vertices, all other cases
  /// follow the sames rules ]
  ///

  monochains_.emplace_back();
  auto *monochain = &monochains_.back();
  monochain->insertion_side = side;
  monochain->list.push_back(first_index);
  monochain->list.push_back(second_index);
  return monochain;
}